

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpaintengine_raster.cpp
# Opt level: O3

void __thiscall
QRasterPaintEngine::drawPoints(QRasterPaintEngine *this,QPointF *points,int pointCount)

{
  QPen *this_00;
  QPaintEnginePrivate *pQVar1;
  QPaintEngineState *pQVar2;
  PenStyle PVar3;
  QPaintEngineState *pQVar4;
  QRasterPaintEngineState *pQVar5;
  long in_FS_OFFSET;
  QCosmeticStroker stroker;
  undefined1 local_10d0 [16];
  qreal qStack_10c0;
  qreal local_10b8;
  qreal qStack_10b0;
  int *local_1078;
  undefined4 uStack_1070;
  undefined4 uStack_106c;
  int iStack_1068;
  undefined8 uStack_1064;
  int local_6c;
  Direction local_4c;
  bool local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar4 = (this->super_QPaintEngineEx).super_QPaintEngine.state;
  pQVar1 = (this->super_QPaintEngineEx).super_QPaintEngine.d_ptr.d;
  pQVar5 = (QRasterPaintEngineState *)(pQVar4 + -2);
  if (pQVar4 == (QPaintEngineState *)0x0) {
    pQVar5 = (QRasterPaintEngineState *)0x0;
  }
  this_00 = &(pQVar5->super_QPainterState).pen;
  if ((pQVar5->lastPen).d.d.ptr == (pQVar5->super_QPainterState).pen.d.d.ptr) {
    PVar3 = QPen::style(this_00);
    if (PVar3 != NoPen) {
      pQVar2 = (this->super_QPaintEngineEx).super_QPaintEngine.state;
      pQVar4 = pQVar2 + -2;
      if (pQVar2 == (QPaintEngineState *)0x0) {
        pQVar4 = (QPaintEngineState *)0x0;
      }
      if (pQVar4[0xb6].dirtyFlags.super_QFlagsStorageHelper<QPaintEngine::DirtyFlag,_4>.
          super_QFlagsStorage<QPaintEngine::DirtyFlag>.i != 0) goto LAB_003c2a7c;
    }
  }
  else {
LAB_003c2a7c:
    updatePen(this,this_00);
  }
  if ((pQVar5->penData).blend != (ProcessSpans)0x0) {
    if (((uint)pQVar5->field_12 & 2) == 0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        QPaintEngineEx::drawPoints(&this->super_QPaintEngineEx,points,pointCount);
        return;
      }
      goto LAB_003c2ba0;
    }
    memcpy((QCosmeticStroker *)local_10d0,&DAT_0069db18,0x1098);
    local_10d0._8_8_ = pQVar1[3].systemTransform.m_matrix[1][2];
    qStack_10c0 = pQVar1[3].systemTransform.m_matrix[2][0];
    local_10b8 = pQVar1[3].systemTransform.m_matrix[1][0];
    qStack_10b0 = pQVar1[3].systemTransform.m_matrix[1][1];
    local_6c = 0;
    local_4c = NoDirection;
    local_40 = false;
    local_1078 = (int *)0x0;
    uStack_1070 = 0;
    uStack_106c = 0;
    iStack_1068 = 0;
    uStack_1064._0_4_ = 0;
    uStack_1064._4_4_ = 0;
    local_10d0._0_8_ = pQVar5;
    QCosmeticStroker::setup((QCosmeticStroker *)local_10d0);
    QCosmeticStroker::drawPoints((QCosmeticStroker *)local_10d0,points,pointCount);
    free(local_1078);
    free((void *)CONCAT44(uStack_106c,uStack_1070));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_003c2ba0:
  __stack_chk_fail();
}

Assistant:

void QRasterPaintEngine::drawPoints(const QPointF *points, int pointCount)
{
    Q_D(QRasterPaintEngine);
    QRasterPaintEngineState *s = state();

    ensurePen();
    if (!s->penData.blend)
        return;

    if (!s->flags.fast_pen) {
        QPaintEngineEx::drawPoints(points, pointCount);
        return;
    }

    QCosmeticStroker stroker(s, d->deviceRect, d->deviceRectUnclipped);
    stroker.drawPoints(points, pointCount);
}